

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_split_pri(REF_SUBDIV ref_subdiv)

{
  uint uVar1;
  uint uVar2;
  REF_STATUS RVar3;
  void *__ptr;
  REF_STATUS ref_private_macro_code_rss_65;
  REF_STATUS ref_private_macro_code_rss_64;
  REF_STATUS ref_private_macro_code_rss_63;
  REF_STATUS ref_private_macro_code_rss_62;
  REF_STATUS ref_private_macro_code_rss_61;
  REF_STATUS ref_private_macro_code_rss_60;
  REF_STATUS ref_private_macro_code_rss_59;
  REF_STATUS ref_private_macro_code_rss_58;
  REF_STATUS ref_private_macro_code_rss_57;
  REF_STATUS ref_private_macro_code_rss_56;
  REF_STATUS ref_private_macro_code_rss_55;
  REF_STATUS ref_private_macro_code_rss_54;
  REF_STATUS ref_private_macro_code_rss_53;
  REF_STATUS ref_private_macro_code_rss_52;
  REF_STATUS ref_private_macro_code_rss_51;
  REF_STATUS ref_private_macro_code_rss_50;
  REF_STATUS ref_private_macro_code_rss_49;
  REF_STATUS ref_private_macro_code_rss_48;
  REF_STATUS ref_private_macro_code_rss_47;
  REF_STATUS ref_private_macro_code_rss_46;
  REF_STATUS ref_private_macro_code_rss_45;
  REF_STATUS ref_private_macro_code_rss_44;
  REF_STATUS ref_private_macro_code_rss_43;
  REF_STATUS ref_private_macro_code_rss_42;
  REF_STATUS ref_private_macro_code_rss_41;
  REF_STATUS ref_private_macro_code_rss_40;
  REF_STATUS ref_private_macro_code_rss_39;
  REF_STATUS ref_private_macro_code_rss_38;
  REF_STATUS ref_private_macro_code_rss_37;
  REF_STATUS ref_private_macro_code_rss_36;
  REF_STATUS ref_private_macro_code_rss_35;
  REF_STATUS ref_private_macro_code_rss_34;
  REF_STATUS ref_private_macro_code_rss_33;
  REF_STATUS ref_private_macro_code_rss_32;
  REF_STATUS ref_private_macro_code_rss_31;
  REF_STATUS ref_private_macro_code_rss_30;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT map;
  REF_INT *marked_for_removal;
  REF_INT local_118;
  REF_INT new_cell;
  REF_INT new_nodes [27];
  REF_INT local_a4;
  REF_INT nodes [27];
  REF_CELL local_30;
  REF_CELL ref_cell_split;
  REF_CELL ref_cell;
  REF_SUBDIV pRStack_18;
  REF_INT cell;
  REF_SUBDIV ref_subdiv_local;
  
  ref_cell_split = ref_subdiv->grid->cell[10];
  pRStack_18 = ref_subdiv;
  if (ref_cell_split->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",0x586,
           "ref_subdiv_split_pri","malloc marked_for_removal of REF_INT negative");
    ref_subdiv_local._4_4_ = 1;
  }
  else {
    __ptr = malloc((long)ref_cell_split->max << 2);
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
             0x586,"ref_subdiv_split_pri","malloc marked_for_removal of REF_INT NULL");
      ref_subdiv_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_cell_split->max;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        *(undefined4 *)((long)__ptr + (long)ref_private_macro_code_rss_1 * 4) = 0;
      }
      uVar1 = ref_cell_create(&local_30,ref_cell_split->type);
      if (uVar1 == 0) {
        for (ref_cell._4_4_ = 0; (int)ref_cell._4_4_ < ref_cell_split->max;
            ref_cell._4_4_ = ref_cell._4_4_ + 1) {
          if (((-1 < (int)ref_cell._4_4_) && ((int)ref_cell._4_4_ < ref_cell_split->max)) &&
             (ref_cell_split->c2n[(int)(ref_cell_split->size_per * ref_cell._4_4_)] != -1)) {
            uVar1 = ref_subdiv_map(pRStack_18,ref_cell_split,ref_cell._4_4_);
            uVar2 = ref_cell_nodes(ref_cell_split,ref_cell._4_4_,new_nodes + 0x1a);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                     ,0x58b,"ref_subdiv_split_pri",(ulong)uVar2,"nodes");
              return uVar2;
            }
            if (uVar1 != 0) {
              if (uVar1 == 0x34) {
                *(undefined4 *)((long)__ptr + (long)(int)ref_cell._4_4_ * 4) = 1;
                uVar1 = ref_cell_nodes(ref_cell_split,ref_cell._4_4_,&local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x592,"ref_subdiv_split_pri",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],nodes[1],&local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x595,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,local_a4,nodes[2],&new_cell);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x598,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[0],nodes[3],new_nodes);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x59b,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4))
                ;
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x59c,"ref_subdiv_split_pri",(ulong)uVar1,"add");
                  return uVar1;
                }
                uVar1 = ref_cell_nodes(ref_cell_split,ref_cell._4_4_,&local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x59e,"ref_subdiv_split_pri",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],nodes[1],new_nodes + 1);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5a1,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,local_a4,nodes[2],new_nodes + 2);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5a4,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[0],nodes[3],new_nodes + 3);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5a7,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4))
                ;
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5a8,"ref_subdiv_split_pri",(ulong)uVar1,"add");
                  return uVar1;
                }
              }
              else if (uVar1 == 0x41) {
                *(undefined4 *)((long)__ptr + (long)(int)ref_cell._4_4_ * 4) = 1;
                uVar1 = ref_cell_nodes(ref_cell_split,ref_cell._4_4_,&local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5ad,"ref_subdiv_split_pri",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_a4,&local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5b0,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[2],new_nodes + 1);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5b3,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4))
                ;
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5b4,"ref_subdiv_split_pri",(ulong)uVar1,"add");
                  return uVar1;
                }
                uVar1 = ref_cell_nodes(ref_cell_split,ref_cell._4_4_,&local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5b6,"ref_subdiv_split_pri",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_a4,&new_cell);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5b9,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[2],new_nodes + 2);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5bc,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4))
                ;
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5bd,"ref_subdiv_split_pri",(ulong)uVar1,"add");
                  return uVar1;
                }
              }
              else if (uVar1 == 0x82) {
                *(undefined4 *)((long)__ptr + (long)(int)ref_cell._4_4_ * 4) = 1;
                uVar1 = ref_cell_nodes(ref_cell_split,ref_cell._4_4_,&local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5c2,"ref_subdiv_split_pri",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],nodes[0],&local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5c5,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[3],new_nodes + 1);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5c8,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4))
                ;
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5c9,"ref_subdiv_split_pri",(ulong)uVar1,"add");
                  return uVar1;
                }
                uVar1 = ref_cell_nodes(ref_cell_split,ref_cell._4_4_,&local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5cb,"ref_subdiv_split_pri",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],nodes[0],new_nodes);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5ce,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[3],new_nodes + 3);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5d1,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4))
                ;
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5d2,"ref_subdiv_split_pri",(ulong)uVar1,"add");
                  return uVar1;
                }
              }
              else if (uVar1 == 0x108) {
                *(undefined4 *)((long)__ptr + (long)(int)ref_cell._4_4_ * 4) = 1;
                uVar1 = ref_cell_nodes(ref_cell_split,ref_cell._4_4_,&local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5d7,"ref_subdiv_split_pri",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,local_a4,nodes[0],&new_cell);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5da,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[2],nodes[3],new_nodes + 2);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5dd,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4))
                ;
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5de,"ref_subdiv_split_pri",(ulong)uVar1,"add");
                  return uVar1;
                }
                uVar1 = ref_cell_nodes(ref_cell_split,ref_cell._4_4_,&local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5e0,"ref_subdiv_split_pri",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,local_a4,nodes[0],new_nodes);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5e3,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[2],nodes[3],new_nodes + 3);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5e6,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4))
                ;
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5e7,"ref_subdiv_split_pri",(ulong)uVar1,"add");
                  return uVar1;
                }
              }
              else {
                if (uVar1 != 0x1cb) {
                  uVar2 = ref_subdiv_map_to_edge(uVar1);
                  if (uVar2 == 0) {
                    printf("pri %d, map %d\n",(ulong)ref_cell._4_4_,(ulong)uVar1);
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                           ,0x636,"ref_subdiv_split_pri",6,"map not implemented yet");
                    return 6;
                  }
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x634,"ref_subdiv_split_pri",(ulong)uVar2,"map2edge");
                  return uVar2;
                }
                *(undefined4 *)((long)__ptr + (long)(int)ref_cell._4_4_ * 4) = 1;
                uVar1 = ref_cell_nodes(ref_cell_split,ref_cell._4_4_,&local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5ed,"ref_subdiv_split_pri",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_a4,&new_cell);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5f0,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],nodes[0],new_nodes);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5f3,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[2],new_nodes + 2);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5f6,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[3],new_nodes + 3);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5f9,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4))
                ;
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5fa,"ref_subdiv_split_pri",(ulong)uVar1,"add");
                  return uVar1;
                }
                uVar1 = ref_cell_nodes(ref_cell_split,ref_cell._4_4_,&local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x5fd,"ref_subdiv_split_pri",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,local_a4,new_nodes[0x1a],&local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x600,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,local_a4,nodes[0],new_nodes);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x603,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[2],nodes[1],new_nodes + 1);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x606,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[2],nodes[3],new_nodes + 3);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x609,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4))
                ;
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x60a,"ref_subdiv_split_pri",(ulong)uVar1,"add");
                  return uVar1;
                }
                uVar1 = ref_cell_nodes(ref_cell_split,ref_cell._4_4_,&local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x60d,"ref_subdiv_split_pri",(ulong)uVar1,"nodes");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[0],local_a4,&new_cell);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x610,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[0],new_nodes[0x1a],&local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x613,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[3],nodes[2],new_nodes + 2);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x616,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[3],nodes[1],new_nodes + 1);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x619,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4))
                ;
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x61a,"ref_subdiv_split_pri",(ulong)uVar1,"add");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,new_nodes[0x1a],local_a4,&local_118);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x61f,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,local_a4,nodes[0],&new_cell);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x622,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[0],new_nodes[0x1a],new_nodes);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x625,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[1],nodes[2],new_nodes + 1);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x629,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[2],nodes[3],new_nodes + 2);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x62c,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_subdiv_node_between(pRStack_18,nodes[3],nodes[1],new_nodes + 3);
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x62f,"ref_subdiv_split_pri",(ulong)uVar1,"mis");
                  return uVar1;
                }
                uVar1 = ref_cell_add(local_30,&local_118,(REF_INT *)((long)&marked_for_removal + 4))
                ;
                if (uVar1 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                         ,0x630,"ref_subdiv_split_pri",(ulong)uVar1,"add");
                  return uVar1;
                }
              }
            }
          }
        }
        for (ref_cell._4_4_ = 0; (int)ref_cell._4_4_ < ref_cell_split->max;
            ref_cell._4_4_ = ref_cell._4_4_ + 1) {
          if ((*(int *)((long)__ptr + (long)(int)ref_cell._4_4_ * 4) == 1) &&
             (uVar1 = ref_cell_remove(ref_cell_split,ref_cell._4_4_), uVar1 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x63c,"ref_subdiv_split_pri",(ulong)uVar1,"remove");
            return uVar1;
          }
        }
        for (ref_cell._4_4_ = 0; (int)ref_cell._4_4_ < local_30->max;
            ref_cell._4_4_ = ref_cell._4_4_ + 1) {
          RVar3 = ref_cell_nodes(local_30,ref_cell._4_4_,new_nodes + 0x1a);
          if ((RVar3 == 0) &&
             (uVar1 = ref_subdiv_add_local_cell(pRStack_18,ref_cell_split,new_nodes + 0x1a),
             uVar1 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c"
                   ,0x63f,"ref_subdiv_split_pri",(ulong)uVar1,"add local");
            return uVar1;
          }
        }
        uVar1 = ref_cell_free(local_30);
        if (uVar1 == 0) {
          free(__ptr);
          ref_subdiv_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x641,"ref_subdiv_split_pri",(ulong)uVar1,"temp ref_cell free");
          ref_subdiv_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0x588,"ref_subdiv_split_pri",(ulong)uVar1,"temp cell");
        ref_subdiv_local._4_4_ = uVar1;
      }
    }
  }
  return ref_subdiv_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_subdiv_split_pri(REF_SUBDIV ref_subdiv) {
  REF_INT cell;
  REF_CELL ref_cell;
  REF_CELL ref_cell_split;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_cell;
  REF_INT *marked_for_removal;

  REF_INT map;

  ref_cell = ref_grid_pri(ref_subdiv_grid(ref_subdiv));

  ref_malloc_init(marked_for_removal, ref_cell_max(ref_cell), REF_INT, 0);

  RSS(ref_cell_create(&ref_cell_split, ref_cell_type(ref_cell)), "temp cell");
  each_ref_cell_valid_cell(ref_cell, cell) {
    map = ref_subdiv_map(ref_subdiv, ref_cell, cell);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    switch (map) {
      case 0: /* don't split */
        break;
      case 52: /* prism split top and bottom, edges 2,4,5 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[3],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[4],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[5],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[3],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[5],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
        break;
      case 65: /* prism split edges 0, 6 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
        break;
      case 130: /* prism split edges 1, 7 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[5],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[5],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
        break;
      case 264: /* prism split edges 3, 8 */
        marked_for_removal[cell] = 1;

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[5],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[5],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");
        break;
      case 459: /* prism split */
        marked_for_removal[cell] = 1;

        /* near edge 0-3 */
        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[5],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* near edge 1-4 */
        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[0],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[2])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[3],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[5],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* near edge 2-5 */
        RSS(ref_cell_nodes(ref_cell, cell, new_nodes), "nodes");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[1],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[5], nodes[4],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[5], nodes[3],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        /* center */
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[0], nodes[1],
                                    &(new_nodes[0])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[1], nodes[2],
                                    &(new_nodes[1])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[2], nodes[0],
                                    &(new_nodes[2])),
            "mis");

        RSS(ref_subdiv_node_between(ref_subdiv, nodes[3], nodes[4],
                                    &(new_nodes[3])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[4], nodes[5],
                                    &(new_nodes[4])),
            "mis");
        RSS(ref_subdiv_node_between(ref_subdiv, nodes[5], nodes[3],
                                    &(new_nodes[5])),
            "mis");
        RSS(ref_cell_add(ref_cell_split, new_nodes, &new_cell), "add");

        break;
      default:
        RSS(ref_subdiv_map_to_edge(map), "map2edge");
        printf("pri %d, map %d\n", cell, map);
        RSS(REF_IMPLEMENT, "map not implemented yet")
    }
  }

  for (cell = 0; cell < ref_cell_max(ref_cell); cell++)
    if (1 == marked_for_removal[cell])
      RSS(ref_cell_remove(ref_cell, cell), "remove");

  each_ref_cell_valid_cell_with_nodes(ref_cell_split, cell, nodes)
      RSS(ref_subdiv_add_local_cell(ref_subdiv, ref_cell, nodes), "add local");

  RSS(ref_cell_free(ref_cell_split), "temp ref_cell free");
  free(marked_for_removal);

  return REF_SUCCESS;
}